

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_etc.cpp
# Opt level: O1

void crnlib::etc1_block::get_abs_subblock_colors
               (color_quad_u8 *pDst,uint16 packed_color4,uint table_idx)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  int iVar6;
  uchar uVar7;
  uint uVar8;
  uint uVar9;
  uchar uVar10;
  uchar uVar11;
  
  uVar5 = (ulong)table_idx;
  uVar9 = packed_color4 >> 4 & 0xf;
  uVar8 = packed_color4 >> 8 & 0xf;
  uVar2 = (packed_color4 & 0xf) << 4 | packed_color4 & 0xf;
  uVar9 = uVar9 << 4 | uVar9;
  uVar8 = uVar8 << 4 | uVar8;
  iVar6 = (&g_etc1_inten_tables)[uVar5 * 4];
  iVar3 = iVar6 + uVar8;
  iVar4 = iVar6 + uVar9;
  if (0xfe < iVar3) {
    iVar3 = 0xff;
  }
  uVar10 = '\0';
  uVar7 = (uchar)iVar3;
  if (iVar3 < 1) {
    uVar7 = uVar10;
  }
  if (0xfe < iVar4) {
    iVar4 = 0xff;
  }
  uVar11 = (uchar)iVar4;
  if (iVar4 < 1) {
    uVar11 = uVar10;
  }
  iVar3 = (&DAT_001ac584)[uVar5 * 4];
  iVar4 = iVar6 + uVar2;
  if (0xfe < (int)(iVar6 + uVar2)) {
    iVar4 = 0xff;
  }
  (pDst->field_0).field_0.r = uVar7;
  if (iVar4 < 1) {
    iVar4 = 0;
  }
  (pDst->field_0).field_0.g = uVar11;
  (pDst->field_0).field_0.b = (uchar)iVar4;
  iVar6 = iVar3 + uVar2;
  iVar4 = iVar3 + uVar8;
  if (0xfe < (int)(iVar3 + uVar8)) {
    iVar4 = 0xff;
  }
  if (iVar4 < 1) {
    iVar4 = 0;
  }
  (pDst->field_0).field_0.a = 0xff;
  iVar1 = iVar3 + uVar9;
  if (0xfe < (int)(iVar3 + uVar9)) {
    iVar1 = 0xff;
  }
  pDst[1].field_0.field_0.r = (uchar)iVar4;
  uVar7 = (uchar)iVar1;
  if (iVar1 < 1) {
    uVar7 = uVar10;
  }
  pDst[1].field_0.field_0.g = uVar7;
  if (0xfe < iVar6) {
    iVar6 = 0xff;
  }
  uVar11 = '\0';
  uVar7 = (uchar)iVar6;
  if (iVar6 < 1) {
    uVar7 = uVar11;
  }
  pDst[1].field_0.field_0.b = uVar7;
  pDst[1].field_0.field_0.a = 0xff;
  iVar4 = *(int *)(&DAT_001ac588 + uVar5 * 0x10);
  iVar3 = iVar4 + uVar8;
  iVar6 = iVar4 + uVar2;
  if (0xfe < iVar3) {
    iVar3 = 0xff;
  }
  uVar7 = (uchar)iVar3;
  if (iVar3 < 1) {
    uVar7 = uVar10;
  }
  iVar3 = iVar4 + uVar9;
  if (0xfe < (int)(iVar4 + uVar9)) {
    iVar3 = 0xff;
  }
  pDst[2].field_0.field_0.r = uVar7;
  uVar7 = (uchar)iVar3;
  if (iVar3 < 1) {
    uVar7 = uVar11;
  }
  pDst[2].field_0.field_0.g = uVar7;
  if (0xfe < iVar6) {
    iVar6 = 0xff;
  }
  uVar7 = (uchar)iVar6;
  if (iVar6 < 1) {
    uVar7 = uVar11;
  }
  pDst[2].field_0.field_0.b = uVar7;
  pDst[2].field_0.field_0.a = 0xff;
  iVar3 = *(int *)(&DAT_001ac58c + uVar5 * 0x10);
  iVar6 = uVar8 + iVar3;
  iVar4 = uVar9 + iVar3;
  iVar3 = uVar2 + iVar3;
  if (0xfe < iVar6) {
    iVar6 = 0xff;
  }
  uVar7 = (uchar)iVar6;
  if (iVar6 < 1) {
    uVar7 = uVar11;
  }
  pDst[3].field_0.field_0.r = uVar7;
  if (0xfe < iVar4) {
    iVar4 = 0xff;
  }
  uVar7 = (uchar)iVar4;
  if (iVar4 < 1) {
    uVar7 = '\0';
  }
  pDst[3].field_0.field_0.g = uVar7;
  if (0xfe < iVar3) {
    iVar3 = 0xff;
  }
  uVar7 = (uchar)iVar3;
  if (iVar3 < 1) {
    uVar7 = '\0';
  }
  pDst[3].field_0.field_0.b = uVar7;
  pDst[3].field_0.field_0.a = 0xff;
  return;
}

Assistant:

void etc1_block::get_abs_subblock_colors(color_quad_u8* pDst, uint16 packed_color4, uint table_idx)
    {
        CRNLIB_ASSERT(table_idx < cETC1IntenModifierValues);
        const int* pInten_modifer_table = &g_etc1_inten_tables[table_idx][0];

        uint r, g, b;
        unpack_color4(r, g, b, packed_color4, true);

        const int ir = static_cast<int>(r), ig = static_cast<int>(g), ib = static_cast<int>(b);

        const int y0 = pInten_modifer_table[0];
        pDst[0].set(ir + y0, ig + y0, ib + y0);

        const int y1 = pInten_modifer_table[1];
        pDst[1].set(ir + y1, ig + y1, ib + y1);

        const int y2 = pInten_modifer_table[2];
        pDst[2].set(ir + y2, ig + y2, ib + y2);

        const int y3 = pInten_modifer_table[3];
        pDst[3].set(ir + y3, ig + y3, ib + y3);
    }